

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

void show_incomplete(TestReporter *reporter,char *file,int line,char *message,
                    __va_list_tag *arguments)

{
  undefined8 *memo;
  
  memo = (undefined8 *)reporter->memo;
  if ((reporter->options != (void *)0x0) && (*(char *)((long)reporter->options + 1) == '\x01')) {
    (*(code *)*memo)("\n");
  }
  (*(code *)*memo)("%s:%d: ",file,line);
  (*(code *)*memo)("Exception: ");
  *(undefined4 *)(memo + 2) = 0;
  walk_breadcrumb(reporter->breadcrumb,show_breadcrumb,memo);
  (*(code *)*memo)("\n\t");
  if (message == (char *)0x0) {
    (*(code *)*memo)(
                    "Test terminated unexpectedly, likely from a non-standard exception or Posix signal"
                    );
  }
  else {
    (*(code *)memo[1])(message,arguments);
  }
  (*(code *)*memo)("\n");
  (*(code *)*memo)();
  fflush((FILE *)0x0);
  return;
}

Assistant:

static void show_incomplete(TestReporter *reporter, const char *file, int line,
                            const char *message, va_list arguments) {
    TextMemo *memo = (TextMemo *)reporter->memo;

    if (have_quiet_mode(reporter))
        memo->printer("\n");    /* To break line of "....." for error message parsing */
    memo->printer("%s:%d: ", file, line);
    memo->printer("Exception: ");

    memo->depth = 0;
    walk_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb, &show_breadcrumb,
                    memo);

    memo->printer("\n\t");
    if (message == NULL) {
        memo->printer("Test terminated unexpectedly, "
                "likely from a non-standard exception or Posix signal");
    } else {
        memo->vprinter(message, arguments);
    }
    memo->printer("\n");
    memo->printer("\n");
    fflush(NULL);
}